

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O0

int compaction_del_cb(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,
                     fdb_doc *doc,uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  fdb_status fVar1;
  long in_RDX;
  int in_ESI;
  long *in_stack_00000008;
  fdb_config *in_stack_00000038;
  char keybuf [256];
  int n;
  int i;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_status s;
  timeval __test_interval_ins;
  timeval __test_interval_total;
  timeval __test_cur;
  timeval __test_prev;
  timeval __test_begin;
  fdb_kvs_handle **in_stack_fffffffffffffe18;
  fdb_kvs_handle *fhandle_00;
  fdb_file_handle *in_stack_fffffffffffffe20;
  fdb_kvs_handle *in_stack_fffffffffffffe38;
  undefined1 *in_stack_fffffffffffffe40;
  fdb_kvs_handle *in_stack_fffffffffffffe48;
  undefined1 *in_stack_fffffffffffffe50;
  fdb_kvs_handle *in_stack_fffffffffffffe58;
  uint local_9c;
  timeval local_40 [2];
  long local_18;
  int local_c;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  gettimeofday(local_40,(__timezone_ptr_t)0x0);
  fhandle_00 = (fdb_kvs_handle *)*in_stack_00000008;
  if (local_c == 1) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x99f);
    compaction_del_cb::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x99f,
                  "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                 );
  }
  if (local_c == 0x10) {
    if (local_18 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0x9a1);
      compaction_del_cb::__test_pass = 0;
      if (local_18 != 0) {
        __assert_fail("!kv_name",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                      ,0x9a1,
                      "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                     );
      }
    }
    if (fhandle_00 != (fdb_kvs_handle *)0x0) {
      fVar1 = fdb_open((fdb_file_handle **)keybuf._8_8_,(char *)keybuf._0_8_,in_stack_00000038);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x9a4);
        compaction_del_cb::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x9a4,
                        "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      fdb_kvs_open_default
                (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,(fdb_kvs_config *)0x111edd);
      for (local_9c = 0; (int)local_9c < 10; local_9c = local_9c + 1) {
        sprintf(&stack0xfffffffffffffe58,"key%d",(ulong)local_9c);
        in_stack_fffffffffffffe50 = &stack0xfffffffffffffe58;
        in_stack_fffffffffffffe48 = fhandle_00;
        strlen(&stack0xfffffffffffffe58);
        fVar1 = fdb_del_kv(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                           (size_t)in_stack_fffffffffffffe38);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x9a9);
          compaction_del_cb::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x9a9,
                          "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
        }
      }
      for (local_9c = 0; (int)local_9c < 10; local_9c = local_9c + 1) {
        sprintf(&stack0xfffffffffffffe58,"KEY%d",(ulong)local_9c);
        in_stack_fffffffffffffe40 = &stack0xfffffffffffffe58;
        in_stack_fffffffffffffe38 = fhandle_00;
        strlen(&stack0xfffffffffffffe58);
        fVar1 = fdb_set_kv(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                           (size_t)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                           (size_t)in_stack_fffffffffffffe38);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x9af);
          compaction_del_cb::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x9af,
                          "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
        }
        strlen(&stack0xfffffffffffffe58);
        fVar1 = fdb_del_kv(in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                           (size_t)in_stack_fffffffffffffe38);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          fprintf(_stderr,"Test failed: %s %d\n",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x9b1);
          compaction_del_cb::__test_pass = 0;
          if (fVar1 != FDB_RESULT_SUCCESS) {
            __assert_fail("s == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                          ,0x9b1,
                          "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                         );
          }
        }
      }
      sprintf(&stack0xfffffffffffffe58,"key%d",(ulong)local_9c);
      strlen(&stack0xfffffffffffffe58);
      fVar1 = fdb_set_kv(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                         (size_t)in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,
                         (size_t)in_stack_fffffffffffffe38);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x9b5);
        compaction_del_cb::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x9b5,
                        "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      fVar1 = fdb_commit((fdb_file_handle *)fhandle_00,'\0');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x9b7);
        compaction_del_cb::__test_pass = 0;
        if (fVar1 != FDB_RESULT_SUCCESS) {
          __assert_fail("s == FDB_RESULT_SUCCESS",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                        ,0x9b7,
                        "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                       );
        }
      }
      fdb_close((fdb_file_handle *)fhandle_00);
      *in_stack_00000008 = 0;
    }
    return 0;
  }
  if (local_c == 8) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x9bc);
    compaction_del_cb::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x9bc,
                  "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                 );
  }
  if (local_c != 2) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0x9c0);
    compaction_del_cb::__test_pass = 0;
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0x9c0,
                  "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                 );
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
          ,0x9be);
  compaction_del_cb::__test_pass = 0;
  __assert_fail("false",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,0x9be,
                "int compaction_del_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
               );
}

Assistant:

static int compaction_del_cb(fdb_file_handle *fhandle,
                             fdb_compaction_status status,
                             const char *kv_name,
                             fdb_doc *doc, uint64_t old_offset,
                             uint64_t new_offset,
                             void *ctx)
{
    TEST_INIT();
    fdb_status s;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db = *(fdb_kvs_handle **)ctx;
    int i;
    int n = 10; // if changing this change caller function too
    char keybuf[256];
    (void) doc;
    (void) new_offset;
    (void) old_offset;

    if (status == FDB_CS_BEGIN) {
        TEST_CHK(false);
    } else if (status == FDB_CS_END) {
        TEST_CHK(!kv_name);
        if (db) { // At end of first phase, mutate more docs...
            s = fdb_open(&dbfile, "./compact_test1", &fhandle->root->config);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            fdb_kvs_open_default(dbfile, &db, &db->kvs_config);
            for (i = 0; i < n; ++i){
                sprintf(keybuf, "key%d", i);
                s = fdb_del_kv(db, keybuf, strlen(keybuf));
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            // Now insert and delete a bunch of keys (all in WAL)
            for (i = 0; i < n; ++i){
                sprintf(keybuf, "KEY%d", i);
                s = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_del_kv(db, keybuf, strlen(keybuf));
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
            sprintf(keybuf, "key%d", i);
            s = fdb_set_kv(db, keybuf, strlen(keybuf), NULL, 0);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
            fdb_close(dbfile);
            *(fdb_kvs_handle **)ctx = NULL; // Don't run in 2nd, 3rd phases
        }
    } else if (status == FDB_CS_FLUSH_WAL) {
        TEST_CHK(false);
    } else if (status == FDB_CS_MOVE_DOC) {
        TEST_CHK(false);
    } else { // FDB_CS_BATCH_MOVE
        TEST_CHK(false);
    }
    return 0;
}